

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5BufferCompare(Fts5Buffer *pLeft,Fts5Buffer *pRight)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int res;
  int nCmp;
  int local_24;
  int local_20;
  int local_1c;
  
  if (*(int *)(in_RDI + 1) < *(int *)(in_RSI + 1)) {
    local_1c = *(int *)(in_RDI + 1);
  }
  else {
    local_1c = *(int *)(in_RSI + 1);
  }
  if (local_1c < 1) {
    local_20 = 0;
  }
  else {
    local_20 = memcmp((void *)*in_RDI,(void *)*in_RSI,(long)local_1c);
  }
  if (local_20 == 0) {
    local_24 = *(int *)(in_RDI + 1) - *(int *)(in_RSI + 1);
  }
  else {
    local_24 = local_20;
  }
  return local_24;
}

Assistant:

static int fts5BufferCompare(Fts5Buffer *pLeft, Fts5Buffer *pRight){
  int nCmp, res;
  nCmp = MIN(pLeft->n, pRight->n);
  assert( nCmp<=0 || pLeft->p!=0 );
  assert( nCmp<=0 || pRight->p!=0 );
  res = fts5Memcmp(pLeft->p, pRight->p, nCmp);
  return (res==0 ? (pLeft->n - pRight->n) : res);
}